

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::SimpleModifier::SimpleModifier
          (SimpleModifier *this,SimpleFormatter *simpleFormatter,Field field,bool strong,
          Parameters parameters)

{
  ushort uVar1;
  char16_t *pcVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined8 uVar7;
  
  uVar7 = parameters._8_8_;
  (this->super_Modifier)._vptr_Modifier = (_func_int **)&PTR__SimpleModifier_003d7590;
  UnicodeString::UnicodeString(&this->fCompiledPattern,&simpleFormatter->compiledPattern);
  this->fField = field;
  this->fStrong = strong;
  (this->fParameters).obj = parameters.obj;
  (this->fParameters).signum = (char)uVar7;
  *(int3 *)&(this->fParameters).field_0x9 = (int3)((ulong)uVar7 >> 8);
  (this->fParameters).plural = (int)((ulong)uVar7 >> 0x20);
  uVar1 = (this->fCompiledPattern).fUnion.fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar2 = (this->fCompiledPattern).fUnion.fFields.fArray;
    }
    else {
      pcVar2 = (this->fCompiledPattern).fUnion.fStackFields.fBuffer;
    }
  }
  else {
    pcVar2 = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    uVar3 = (this->fCompiledPattern).fUnion.fFields.fLength;
  }
  else {
    uVar3 = (int)(short)uVar1 >> 5;
  }
  iVar6 = 0xfeff;
  if (uVar3 != 0) {
    if (*pcVar2 != L'\0') {
      uVar5 = 0xffff;
      if (uVar3 == 1) {
LAB_002626f9:
        this->fPrefixLength = uVar5 - 0x100;
        uVar5 = uVar5 - 0xfd;
        uVar4 = uVar5;
      }
      else {
        if ((uVar1 & 2) == 0) {
          pcVar2 = (this->fCompiledPattern).fUnion.fFields.fArray;
        }
        else {
          pcVar2 = (char16_t *)((long)&(this->fCompiledPattern).fUnion + 2);
        }
        uVar5 = (uint)(ushort)pcVar2[1];
        if (pcVar2[1] != L'\0') goto LAB_002626f9;
        this->fPrefixLength = 0;
        uVar4 = 2;
        uVar5 = 3;
      }
      this->fSuffixOffset = uVar4;
      iVar6 = 0;
      if (((int)uVar5 < (int)uVar3) && (iVar6 = 0xfeff, uVar4 < uVar3)) {
        if ((uVar1 & 2) == 0) {
          pcVar2 = (this->fCompiledPattern).fUnion.fFields.fArray;
        }
        else {
          pcVar2 = (char16_t *)((long)&(this->fCompiledPattern).fUnion + 2);
        }
        iVar6 = (ushort)pcVar2[(int)uVar4] - 0x100;
      }
      goto LAB_00262753;
    }
    if (uVar3 != 1) {
      if ((uVar1 & 2) == 0) {
        pcVar2 = (this->fCompiledPattern).fUnion.fFields.fArray;
      }
      else {
        pcVar2 = (char16_t *)((long)&(this->fCompiledPattern).fUnion + 2);
      }
      iVar6 = (ushort)pcVar2[1] - 0x100;
    }
  }
  this->fPrefixLength = iVar6;
  this->fSuffixOffset = -1;
  iVar6 = 0;
LAB_00262753:
  this->fSuffixLength = iVar6;
  return;
}

Assistant:

SimpleModifier::SimpleModifier(const SimpleFormatter &simpleFormatter, Field field, bool strong,
                               const Modifier::Parameters parameters)
        : fCompiledPattern(simpleFormatter.compiledPattern), fField(field), fStrong(strong),
          fParameters(parameters) {
    int32_t argLimit = SimpleFormatter::getArgumentLimit(
            fCompiledPattern.getBuffer(), fCompiledPattern.length());
    if (argLimit == 0) {
        // No arguments in compiled pattern
        fPrefixLength = fCompiledPattern.charAt(1) - ARG_NUM_LIMIT;
        U_ASSERT(2 + fPrefixLength == fCompiledPattern.length());
        // Set suffixOffset = -1 to indicate no arguments in compiled pattern.
        fSuffixOffset = -1;
        fSuffixLength = 0;
    } else {
        U_ASSERT(argLimit == 1);
        if (fCompiledPattern.charAt(1) != 0) {
            // Found prefix
            fPrefixLength = fCompiledPattern.charAt(1) - ARG_NUM_LIMIT;
            fSuffixOffset = 3 + fPrefixLength;
        } else {
            // No prefix
            fPrefixLength = 0;
            fSuffixOffset = 2;
        }
        if (3 + fPrefixLength < fCompiledPattern.length()) {
            // Found suffix
            fSuffixLength = fCompiledPattern.charAt(fSuffixOffset) - ARG_NUM_LIMIT;
        } else {
            // No suffix
            fSuffixLength = 0;
        }
    }
}